

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.cpp
# Opt level: O2

void __thiscall listener::on_event(listener *this,int events)

{
  uint uVar1;
  int iVar2;
  session *this_00;
  sockaddr_in remote;
  
  if ((events & 1U) != 0) {
    uVar1 = net_accept(this->listenfd_,&remote);
    if (-1 < (int)uVar1) {
      this_00 = (session *)operator_new(0x70);
      session::session(this_00,this->network_,this->manager_);
      iVar2 = session::init(this_00,(EVP_PKEY_CTX *)(ulong)uVar1);
      if ((char)iVar2 == '\0') {
        (*(this_00->super_iobject)._vptr_iobject[1])(this_00);
      }
      else {
        network::add_object(this->network_,(iobject *)this_00);
        (**this->manager_->_vptr_imanager)
                  (this->manager_,(ulong)(uint)(this_00->super_iobject).netid_,0);
      }
    }
    return;
  }
  __assert_fail("events & EVENT_READ",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jinjiazhang[P]protonet/protonet/listener.cpp"
                ,0x1d,"virtual void listener::on_event(int)");
}

Assistant:

void listener::on_event(int events)
{
    assert(events & EVENT_READ);
    sockaddr_in remote;
    socket_t fd = net_accept(listenfd_, remote);
    if (fd < 0)
    {
        return;
    }

    session* object = new session(network_, manager_);
    if (!object->init(fd))
    {
        delete object;
        return;
    }

    network_->add_object(object);
    manager_->on_accept(object->get_netid(), 0);
}